

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agc.c
# Opt level: O1

int WebRtcAgc_VirtualMic
              (void *agcInst,int16_t **in_near,size_t num_bands,size_t samples,int32_t micLevelIn,
              int32_t *micLevelOut)

{
  short *psVar1;
  uint uVar2;
  short sVar3;
  uint16_t uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  size_t sVar8;
  uint16_t *puVar9;
  size_t sVar10;
  
  uVar2 = 11000;
  if (*agcInst == 8000) {
    uVar2 = 0x157c;
  }
  psVar1 = *in_near;
  uVar6 = (int)*psVar1 * (int)*psVar1;
  if (samples < 2) {
    sVar3 = 0;
  }
  else {
    sVar8 = 1;
    sVar3 = 0;
    do {
      if (uVar6 < uVar2) {
        uVar6 = uVar6 + (int)psVar1[sVar8] * (int)psVar1[sVar8];
      }
      sVar3 = sVar3 - ((short)(psVar1[sVar8 - 1] ^ psVar1[sVar8]) >> 0xf);
      sVar8 = sVar8 + 1;
    } while (samples != sVar8);
  }
  if (((uVar6 < 500) || (sVar3 < 6)) || ((0xf < sVar3 && ((uVar6 <= uVar2 || (0x13 < sVar3)))))) {
    *(undefined2 *)((long)agcInst + 0x298) = 1;
  }
  else {
    *(undefined2 *)((long)agcInst + 0x298) = 0;
  }
  iVar5 = micLevelIn << (*(byte *)((long)agcInst + 0x15c) & 0x1f);
  iVar7 = *(int *)((long)agcInst + 0x144);
  if (*(int *)((long)agcInst + 0x13c) < *(int *)((long)agcInst + 0x144)) {
    iVar7 = *(int *)((long)agcInst + 0x13c);
  }
  if (iVar5 != *(int *)((long)agcInst + 0x130)) {
    *(int *)((long)agcInst + 0x130) = iVar5;
    iVar7 = 0x7f;
    *(undefined4 *)((long)agcInst + 0x13c) = 0x7f;
    *micLevelOut = 0x7f;
    *(undefined4 *)((long)agcInst + 0x138) = 0x7f;
  }
  if (samples != 0) {
    puVar9 = kSuppressionTableVirtualMic + (uint)-(iVar7 + -0x7f);
    if (0x7f < iVar7) {
      puVar9 = kGainTableVirtualMic + (iVar7 - 0x80);
    }
    uVar4 = *puVar9;
    sVar8 = 0;
    do {
      iVar5 = (int)((uint)uVar4 * (int)psVar1[sVar8]) >> 10;
      if (0x7fff < iVar5) {
        uVar2 = 0x80 - iVar7;
        if (0x7f < iVar7) {
          uVar2 = iVar7 - 0x80;
        }
        puVar9 = kSuppressionTableVirtualMic;
        if (0x7f < iVar7) {
          puVar9 = kGainTableVirtualMic;
        }
        iVar7 = iVar7 + -1;
        uVar4 = puVar9[uVar2];
        iVar5 = 0x7fff;
      }
      if (iVar5 < -0x8000) {
        uVar2 = 0x80 - iVar7;
        if (0x7f < iVar7) {
          uVar2 = iVar7 - 0x80;
        }
        puVar9 = kSuppressionTableVirtualMic;
        if (0x7f < iVar7) {
          puVar9 = kGainTableVirtualMic;
        }
        iVar7 = iVar7 + -1;
        uVar4 = puVar9[uVar2];
        iVar5 = -0x8000;
      }
      psVar1[sVar8] = (short)iVar5;
      if (1 < num_bands) {
        sVar10 = 1;
        do {
          iVar5 = (int)((int)in_near[sVar10][sVar8] * (uint)uVar4) >> 10;
          if (0x7ffe < iVar5) {
            iVar5 = 0x7fff;
          }
          if (iVar5 < -0x7fff) {
            iVar5 = -0x8000;
          }
          in_near[sVar10][sVar8] = (int16_t)iVar5;
          sVar10 = sVar10 + 1;
        } while (num_bands != sVar10);
      }
      sVar8 = sVar8 + 1;
    } while (sVar8 != samples);
  }
  *(int *)((long)agcInst + 0x138) = iVar7;
  *micLevelOut = iVar7 >> (*(byte *)((long)agcInst + 0x15c) & 0x1f);
  iVar7 = WebRtcAgc_AddMic(agcInst,in_near,num_bands,samples);
  return -(uint)(iVar7 != 0);
}

Assistant:

int WebRtcAgc_VirtualMic(void *agcInst, int16_t *const *in_near, size_t num_bands, size_t samples, int32_t micLevelIn,
                         int32_t *micLevelOut) {
    int32_t tmpFlt, micLevelTmp, gainIdx;
    uint16_t gain;
    size_t ii, j;
    LegacyAgc *stt;

    uint32_t nrg;
    size_t sampleCntr;
    uint32_t frameNrg = 0;
    uint32_t frameNrgLimit = 5500;
    int16_t numZeroCrossing = 0;
    const int16_t kZeroCrossingLowLim = 15;
    const int16_t kZeroCrossingHighLim = 20;

    stt = (LegacyAgc *) agcInst;

    /*
     *  Before applying gain decide if this is a low-level signal.
     *  The idea is that digital AGC will not adapt to low-level
     *  signals.
     */
    if (stt->fs != 8000) {
        frameNrgLimit = frameNrgLimit << 1;
    }

    frameNrg = (uint32_t)(in_near[0][0] * in_near[0][0]);
    for (sampleCntr = 1; sampleCntr < samples; sampleCntr++) {
        // increment frame energy if it is less than the limit
        // the correct value of the energy is not important
        if (frameNrg < frameNrgLimit) {
            nrg = (uint32_t)(in_near[0][sampleCntr] * in_near[0][sampleCntr]);
            frameNrg += nrg;
        }

        // Count the zero crossings
        numZeroCrossing += ((in_near[0][sampleCntr] ^ in_near[0][sampleCntr - 1]) < 0);
    }

    if ((frameNrg < 500) || (numZeroCrossing <= 5)) {
        stt->lowLevelSignal = 1;
    } else if (numZeroCrossing <= kZeroCrossingLowLim) {
        stt->lowLevelSignal = 0;
    } else if (frameNrg <= frameNrgLimit) {
        stt->lowLevelSignal = 1;
    } else if (numZeroCrossing >= kZeroCrossingHighLim) {
        stt->lowLevelSignal = 1;
    } else {
        stt->lowLevelSignal = 0;
    }

    micLevelTmp = micLevelIn << stt->scale;
    /* Set desired level */
    gainIdx = stt->micVol;
    if (stt->micVol > stt->maxAnalog) {
        gainIdx = stt->maxAnalog;
    }
    if (micLevelTmp != stt->micRef) {
        /* Something has happened with the physical level, restart. */
        stt->micRef = micLevelTmp;
        stt->micVol = 127;
        *micLevelOut = 127;
        stt->micGainIdx = 127;
        gainIdx = 127;
    }
    /* Pre-process the signal to emulate the microphone level. */
    /* Take one step at a time in the gain table. */
    if (gainIdx > 127) {
        gain = kGainTableVirtualMic[gainIdx - 128];
    } else {
        gain = kSuppressionTableVirtualMic[127 - gainIdx];
    }
    for (ii = 0; ii < samples; ii++) {
        tmpFlt = (in_near[0][ii] * gain) >> 10;
        if (tmpFlt > 32767) {
            tmpFlt = 32767;
            gainIdx--;
            if (gainIdx >= 127) {
                gain = kGainTableVirtualMic[gainIdx - 127];
            } else {
                gain = kSuppressionTableVirtualMic[127 - gainIdx];
            }
        }
        if (tmpFlt < -32768) {
            tmpFlt = -32768;
            gainIdx--;
            if (gainIdx >= 127) {
                gain = kGainTableVirtualMic[gainIdx - 127];
            } else {
                gain = kSuppressionTableVirtualMic[127 - gainIdx];
            }
        }
        in_near[0][ii] = (int16_t) tmpFlt;
        for (j = 1; j < num_bands; ++j) {
            tmpFlt = (in_near[j][ii] * gain) >> 10;
            if (tmpFlt > 32767) {
                tmpFlt = 32767;
            }
            if (tmpFlt < -32768) {
                tmpFlt = -32768;
            }
            in_near[j][ii] = (int16_t) tmpFlt;
        }
    }
    /* Set the level we (finally) used */
    stt->micGainIdx = gainIdx;
    //    *micLevelOut = stt->micGainIdx;
    *micLevelOut = stt->micGainIdx >> stt->scale;
    /* Add to Mic as if it was the output from a true microphone */
    if (WebRtcAgc_AddMic(agcInst, in_near, num_bands, samples) != 0) {
        return -1;
    }
    return 0;
}